

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aq.c
# Opt level: O3

void aq_enqueue_frame(aq_t *q,mp3_frame_t *frame)

{
  void *__dest;
  dlist_t *pdVar1;
  
  if (frame == (mp3_frame_t *)0x0) {
    __assert_fail("frame != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/wesen[P]poc/aq.c",0x45,
                  "void aq_enqueue_frame(aq_t *, mp3_frame_t *)");
  }
  __dest = malloc(0x5e60);
  if (__dest != (void *)0x0) {
    memcpy(__dest,frame,0x5e60);
    pdVar1 = dlist_ins_end(&q->frames,__dest);
    if (pdVar1 != (dlist_t *)0x0) {
      q->size = q->size + *(long *)((long)__dest + 0x4eb0);
      return;
    }
    __assert_fail("dlist != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/wesen[P]poc/aq.c",0x4d,
                  "void aq_enqueue_frame(aq_t *, mp3_frame_t *)");
  }
  __assert_fail("tmp_frame != NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/wesen[P]poc/aq.c",0x48,
                "void aq_enqueue_frame(aq_t *, mp3_frame_t *)");
}

Assistant:

static void aq_enqueue_frame(aq_t *q, mp3_frame_t *frame) {
  assert(q != NULL);
  assert(frame != NULL);

  mp3_frame_t *tmp_frame = malloc(sizeof(mp3_frame_t));
  assert(tmp_frame != NULL);

  memcpy(tmp_frame, frame, sizeof(mp3_frame_t));

  dlist_t *dlist = dlist_ins_end(&q->frames, tmp_frame);
  assert(dlist != NULL);
  q->size += tmp_frame->frame_data_size;
}